

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

char gear_to_label(player *p,object *obj)

{
  ushort uVar1;
  char cVar2;
  wchar_t wVar3;
  ulong uVar4;
  ulong uVar5;
  object **ppoVar6;
  
  uVar1 = (p->body).count;
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    ppoVar6 = &((p->body).slots)->obj;
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if (*ppoVar6 == obj) break;
      uVar5 = uVar5 + 1;
      ppoVar6 = ppoVar6 + 4;
      uVar4 = (ulong)uVar1;
    } while (uVar1 != uVar5);
  }
  if ((int)uVar4 < (int)(uint)uVar1) {
    wVar3 = equipped_item_slot(p->body,obj);
    cVar2 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[wVar3];
  }
  else {
    if ((ulong)z_info->quiver_size != 0) {
      uVar4 = 0;
      do {
        if (p->upkeep->quiver[uVar4] == obj) {
          return (char)uVar4 + '0';
        }
        uVar4 = uVar4 + 1;
      } while (z_info->quiver_size != uVar4);
    }
    if ((ulong)z_info->pack_size != 0) {
      uVar4 = 0;
      do {
        if (p->upkeep->inven[uVar4] == obj) {
          return "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while (z_info->pack_size != uVar4);
    }
    cVar2 = '\0';
  }
  return cVar2;
}

Assistant:

char gear_to_label(struct player *p, struct object *obj)
{
	/* Skip rogue-like cardinal direction movement keys. */
	const char labels[] =
		 "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
	int i;

	/* Equipment is easy */
	if (object_is_equipped(p->body, obj)) {
		return labels[equipped_item_slot(p->body, obj)];
	}

	/* Check the quiver */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i] == obj) {
			return I2D(i);
		}
	}

	/* Check the inventory */
	for (i = 0; i < z_info->pack_size; i++) {
		if (p->upkeep->inven[i] == obj) {
			return labels[i];
		}
	}

	return '\0';
}